

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_timestamp.cpp
# Opt level: O1

Int96 duckdb::TimestampToImpalaTimestamp(timestamp_t *ts)

{
  date_t date;
  dtime_t dtime;
  int64_t iVar1;
  Int96 IVar2;
  int32_t msec;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  dtime = Timestamp::GetTime(ts->value);
  Time::Convert(dtime,&local_2c,&local_30,&local_34,&local_38);
  date = Timestamp::GetDate((timestamp_t)ts->value);
  iVar1 = Date::Epoch(date);
  IVar2.value._0_8_ =
       ((long)local_38 + (long)local_34 * 1000 + (long)(local_30 * 60000 + local_2c * 3600000)) *
       1000000;
  IVar2.value[2] =
       ((int)(SUB168(SEXT816(iVar1) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) -
       (SUB164(SEXT816(iVar1) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f)) + 0x253d8c;
  return (Int96)IVar2.value;
}

Assistant:

Int96 TimestampToImpalaTimestamp(timestamp_t &ts) {
	int32_t hour, min, sec, msec;
	Time::Convert(Timestamp::GetTime(ts), hour, min, sec, msec);
	uint64_t ms_since_midnight = hour * 60 * 60 * 1000 + min * 60 * 1000 + sec * 1000 + msec;
	auto days_since_epoch = Date::Epoch(Timestamp::GetDate(ts)) / int64_t(24 * 60 * 60);
	// first two uint32 in Int96 are nanoseconds since midnights
	// last uint32 is number of days since year 4713 BC ("Julian date")
	Int96 impala_ts;
	Store<uint64_t>(ms_since_midnight * 1000000, data_ptr_cast(impala_ts.value));
	impala_ts.value[2] = days_since_epoch + JULIAN_TO_UNIX_EPOCH_DAYS;
	return impala_ts;
}